

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O0

size_t wasm::FunctionHasher::flexibleHashFunction(Function *func,ExprHasher *customHasher)

{
  Expression *curr;
  bool bVar1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *this;
  reference pTVar2;
  size_t otherDigest;
  function<bool_(wasm::Expression_*,_unsigned_long_&)> local_68;
  TypeID local_48;
  Type local_40;
  Type type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  size_t digest;
  ExprHasher *customHasher_local;
  Function *func_local;
  
  digest = (size_t)customHasher;
  customHasher_local = (ExprHasher *)func;
  __range2 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)hash<wasm::HeapType>(&func->type);
  this = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
         ((long)&customHasher_local[2].super__Function_base._M_functor + 8);
  __end2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(this);
  type.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                *)&type);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
             ::operator*(&__end2);
    local_40.id = pTVar2->id;
    local_48 = wasm::Type::getID(&local_40);
    rehash<unsigned_long>((size_t *)&__range2,&local_48);
    __gnu_cxx::
    __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
    operator++(&__end2);
  }
  curr = *(Expression **)&customHasher_local[3].super__Function_base._M_functor;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function(&local_68,customHasher);
  otherDigest = ExpressionAnalyzer::flexibleHash(curr,&local_68);
  hash_combine((size_t *)&__range2,otherDigest);
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::~function(&local_68);
  return (size_t)__range2;
}

Assistant:

static size_t
  flexibleHashFunction(Function* func,
                       ExpressionAnalyzer::ExprHasher customHasher) {
    auto digest = hash(func->type);
    for (auto type : func->vars) {
      rehash(digest, type.getID());
    }
    hash_combine(digest,
                 ExpressionAnalyzer::flexibleHash(func->body, customHasher));
    return digest;
  }